

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O3

int stbir__perform_resize(stbir__info *info,int split_start,int split_count)

{
  stbir__per_split_info *split_info;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  stbir__per_split_info *psVar5;
  float *pfVar6;
  int iVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  int iVar10;
  float *pfVar11;
  float *pfVar12;
  STBIR_VERTICAL_GATHERFUNC **ppSVar13;
  float *pfVar14;
  STBIR_VERTICAL_SCATTERFUNC **ppSVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  stbir__contributors *psVar21;
  stbir__per_split_info *psVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  int iVar26;
  long lVar27;
  long lVar28;
  float fVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  int iVar34;
  code *local_e8;
  float *local_d0;
  float *local_78 [9];
  
  psVar5 = info->split_info;
  split_info = psVar5 + (uint)split_start;
  psVar21 = (info->vertical).contributors;
  pfVar11 = (info->vertical).coefficients;
  iVar1 = psVar5[(uint)split_start].start_output_y;
  iVar2 = split_info[(long)split_count + -1].end_output_y;
  if ((info->vertical).is_gather == 0) {
    iVar19 = split_info->start_input_y;
    if (info->vertical_first == 0) {
      psVar22 = (stbir__per_split_info *)&split_info->vertical_buffer;
      iVar17 = (info->horizontal).scale_info.output_sub_size;
      local_e8 = stbir__encode_first_scanline_from_scatter;
    }
    else {
      iVar17 = ((info->scanline_extents).conservative.n1 - (info->scanline_extents).conservative.n0)
               + 1;
      local_e8 = stbir__horizontal_resample_and_encode_first_scanline_from_scatter;
      psVar22 = split_info;
    }
    iVar16 = (info->vertical).filter_pixel_margin;
    iVar18 = (info->vertical).coefficient_width;
    iVar3 = split_info[(long)split_count + -1].end_input_y;
    pfVar6 = psVar22->decode_buffer;
    iVar4 = info->effective_channels;
    split_info->ring_buffer_first_scanline = iVar1;
    split_info->ring_buffer_last_scanline = -1;
    auVar9 = _DAT_005ce310;
    split_info->ring_buffer_begin_index = -1;
    iVar10 = info->ring_buffer_num_entries;
    if (0 < (long)iVar10) {
      pfVar14 = split_info->ring_buffer;
      lVar27 = (long)info->ring_buffer_length_bytes;
      uVar24 = (ulong)(iVar10 + 3U & 0xfffffffc);
      lVar28 = (long)iVar10 + -1;
      auVar30._8_4_ = (int)lVar28;
      auVar30._0_8_ = lVar28;
      auVar30._12_4_ = (int)((ulong)lVar28 >> 0x20);
      auVar30 = auVar30 ^ _DAT_005ce310;
      auVar31 = _DAT_005ce320;
      auVar32 = _DAT_005ce300;
      do {
        auVar33 = auVar32 ^ auVar9;
        iVar10 = auVar30._4_4_;
        if ((bool)(~(auVar33._4_4_ == iVar10 && auVar30._0_4_ < auVar33._0_4_ ||
                    iVar10 < auVar33._4_4_) & 1)) {
          *pfVar14 = 3e+38;
        }
        if ((auVar33._12_4_ != auVar30._12_4_ || auVar33._8_4_ <= auVar30._8_4_) &&
            auVar33._12_4_ <= auVar30._12_4_) {
          *(undefined4 *)((long)pfVar14 + lVar27) = 0x7f61b1e6;
        }
        auVar33 = auVar31 ^ auVar9;
        iVar34 = auVar33._4_4_;
        if (iVar34 <= iVar10 && (iVar34 != iVar10 || auVar33._0_4_ <= auVar30._0_4_)) {
          *(undefined4 *)((long)pfVar14 + lVar27 * 2) = 0x7f61b1e6;
          *(undefined4 *)((long)pfVar14 + lVar27 * 3) = 0x7f61b1e6;
        }
        lVar28 = auVar32._8_8_;
        auVar32._0_8_ = auVar32._0_8_ + 4;
        auVar32._8_8_ = lVar28 + 4;
        lVar28 = auVar31._8_8_;
        auVar31._0_8_ = auVar31._0_8_ + 4;
        auVar31._8_8_ = lVar28 + 4;
        pfVar14 = pfVar14 + lVar27;
        uVar24 = uVar24 - 4;
      } while (uVar24 != 0);
    }
    if (iVar19 < iVar3) {
      lVar27 = (long)iVar16 + (long)iVar19;
      psVar21 = psVar21 + lVar27;
      pfVar11 = pfVar11 + (long)iVar18 * (long)(int)lVar27;
      bVar8 = true;
      iVar16 = iVar19;
      iVar18 = iVar19;
      do {
        iVar10 = psVar21->n0;
        iVar34 = psVar21->n1;
        if (info->ring_buffer_num_entries <= iVar34 - iVar10) {
          __assert_fail("out_last_scanline - out_first_scanline + 1 <= stbir_info->ring_buffer_num_entries"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/stb_image_resize2.h"
                        ,0x191b,
                        "void stbir__vertical_scatter_loop(const stbir__info *, stbir__per_split_info *, int)"
                       );
        }
        if ((iVar10 <= iVar34) &&
           (((iVar1 <= iVar10 && (iVar10 < iVar2)) || ((iVar1 <= iVar34 && (iVar34 < iVar2)))))) {
          if ((bVar8) && (iVar19 < iVar16)) {
            split_info->start_input_y = iVar16;
          }
          iVar18 = iVar1;
          if (iVar10 - iVar1 != 0 && iVar1 <= iVar10) {
            iVar18 = iVar10;
          }
          iVar7 = -(iVar10 - iVar1);
          if (iVar1 <= iVar10) {
            iVar7 = 0;
          }
          if (iVar2 <= iVar34) {
            iVar34 = iVar2 + -1;
          }
          iVar10 = split_info->ring_buffer_begin_index;
          if (iVar10 < 0) {
            iVar10 = iVar18 - iVar1;
            split_info->ring_buffer_begin_index = iVar10;
          }
          if (iVar18 < iVar10) {
            __assert_fail("split_info->ring_buffer_begin_index <= out_first_scanline",
                          "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/stb_image_resize2.h"
                          ,0x1935,
                          "void stbir__vertical_scatter_loop(const stbir__info *, stbir__per_split_info *, int)"
                         );
          }
          stbir__decode_scanline(info,iVar16,split_info->decode_buffer);
          if (info->vertical_first == 0) {
            stbir__resample_horizontal_gather
                      (info,split_info->vertical_buffer,split_info->decode_buffer);
          }
          if (((split_info->ring_buffer_last_scanline - split_info->ring_buffer_first_scanline) + 1
               == info->ring_buffer_num_entries) && (split_info->ring_buffer_last_scanline < iVar34)
             ) {
            (*local_e8)(info,split_info);
          }
          if ((info->vertical).is_gather != 0) {
            __assert_fail("!stbir_info->vertical.is_gather",
                          "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/stb_image_resize2.h"
                          ,0x18c7,
                          "void stbir__resample_vertical_scatter(const stbir__info *, stbir__per_split_info *, int, int, const float *, const float *, const float *)"
                         );
          }
          if (iVar34 - iVar18 < 0) {
            __assert_fail("total > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/stb_image_resize2.h"
                          ,0x18cc,
                          "void stbir__resample_vertical_scatter(const stbir__info *, stbir__per_split_info *, int, int, const float *, const float *, const float *)"
                         );
          }
          uVar20 = (iVar34 - iVar18) + 1;
          iVar10 = 0;
          do {
            uVar24 = 8;
            if (uVar20 < 8) {
              uVar24 = (ulong)uVar20;
            }
            uVar23 = 0;
            do {
              pfVar14 = stbir__get_ring_buffer_scanline
                                  (info,split_info,iVar18 + iVar10 + (int)uVar23);
              local_78[uVar23] = pfVar14;
              if ((uVar23 != 0) && (fVar29 = *local_78[0], (*pfVar14 == 3e+38) == (fVar29 != 3e+38))
                 ) {
                uVar24 = uVar23 & 0xffffffff;
                goto LAB_004499a3;
              }
              uVar23 = uVar23 + 1;
            } while (uVar24 != uVar23);
            fVar29 = *local_78[0];
LAB_004499a3:
            ppSVar15 = stbir__vertical_scatter_sets;
            if (fVar29 != 3e+38) {
              ppSVar15 = stbir__vertical_scatter_blends;
            }
            if (NAN(fVar29)) {
              ppSVar15 = stbir__vertical_scatter_blends;
            }
            iVar26 = (int)uVar24;
            (*ppSVar15[(long)iVar26 + -1])
                      (local_78,pfVar11 + (long)iVar7 + (long)iVar10,pfVar6,
                       pfVar6 + (long)iVar17 * (long)iVar4);
            iVar10 = iVar10 + iVar26;
            uVar20 = uVar20 - iVar26;
          } while (uVar20 != 0);
          bVar8 = false;
          iVar18 = iVar16;
          if (split_info->ring_buffer_last_scanline < iVar34) {
            split_info->ring_buffer_last_scanline = iVar34;
          }
        }
        psVar21 = psVar21 + 1;
        pfVar11 = pfVar11 + (info->vertical).coefficient_width;
        iVar16 = iVar16 + 1;
      } while (iVar16 != iVar3);
      iVar1 = split_info->ring_buffer_first_scanline;
      iVar19 = iVar18;
    }
    while (iVar1 < iVar2) {
      (*local_e8)(info,split_info);
      iVar1 = split_info->ring_buffer_first_scanline;
    }
    pfVar11 = (float *)(ulong)(uint)split_count;
    if (0 < split_count) {
      pfVar11 = (float *)((ulong)(uint)split_count * 0x78);
      lVar27 = 0;
      do {
        if (iVar19 + 1 < *(int *)(psVar5[(uint)split_start].no_cache_straddle + lVar27 + -0x18)) {
          *(int *)(psVar5[(uint)split_start].no_cache_straddle + lVar27 + -0x18) = iVar19 + 1;
        }
        lVar27 = lVar27 + 0x78;
      } while ((long)pfVar11 - lVar27 != 0);
    }
  }
  else {
    lVar27 = (long)iVar1;
    iVar19 = (info->vertical).coefficient_width;
    split_info->ring_buffer_begin_index = 0;
    iVar17 = psVar21[lVar27].n0;
    split_info->ring_buffer_first_scanline = iVar17;
    split_info->ring_buffer_last_scanline = iVar17 + -1;
    if (iVar1 < iVar2) {
      psVar21 = psVar21 + lVar27;
      local_d0 = pfVar11 + iVar19 * lVar27;
      do {
        iVar1 = psVar21->n0;
        if (iVar1 < split_info->ring_buffer_first_scanline) {
          __assert_fail("in_first_scanline >= split_info->ring_buffer_first_scanline",
                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/stb_image_resize2.h"
                        ,0x187a,
                        "void stbir__vertical_gather_loop(const stbir__info *, stbir__per_split_info *, int)"
                       );
        }
        iVar19 = psVar21->n1;
        iVar17 = split_info->ring_buffer_last_scanline;
        while (iVar17 < iVar19) {
          iVar16 = iVar17 - split_info->ring_buffer_first_scanline;
          if (info->ring_buffer_num_entries <= iVar16) {
            __assert_fail("( split_info->ring_buffer_last_scanline - split_info->ring_buffer_first_scanline + 1 ) <= stbir_info->ring_buffer_num_entries"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/stb_image_resize2.h"
                          ,0x187f,
                          "void stbir__vertical_gather_loop(const stbir__info *, stbir__per_split_info *, int)"
                         );
          }
          if (iVar16 + 1 == info->ring_buffer_num_entries) {
            split_info->ring_buffer_first_scanline = split_info->ring_buffer_first_scanline + 1;
            split_info->ring_buffer_begin_index = split_info->ring_buffer_begin_index + 1;
          }
          iVar17 = iVar17 + 1;
          if (info->vertical_first == 0) {
            stbir__decode_scanline(info,iVar17,split_info->decode_buffer);
            split_info->ring_buffer_last_scanline = iVar17;
            if (info->ring_buffer_num_entries < 0) {
              __assert_fail("index < stbir_info->ring_buffer_num_entries",
                            "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/stb_image_resize2.h"
                            ,0x1807,
                            "float *stbir__get_ring_buffer_entry(const stbir__info *, const stbir__per_split_info *, int)"
                           );
            }
            stbir__resample_horizontal_gather
                      (info,(float *)((long)(((iVar17 + split_info->ring_buffer_begin_index) -
                                             split_info->ring_buffer_first_scanline) %
                                            info->ring_buffer_num_entries) *
                                      (long)info->ring_buffer_length_bytes +
                                     (long)split_info->ring_buffer),split_info->decode_buffer);
          }
          else {
            split_info->ring_buffer_last_scanline = iVar17;
            pfVar11 = stbir__get_ring_buffer_scanline(info,split_info,iVar17);
            stbir__decode_scanline(info,split_info->ring_buffer_last_scanline,pfVar11);
          }
          iVar17 = split_info->ring_buffer_last_scanline;
        }
        iVar17 = info->vertical_first;
        if (iVar17 == 0) {
          iVar16 = (info->horizontal).scale_info.output_sub_size;
        }
        else {
          iVar16 = ((info->scanline_extents).conservative.n1 -
                   (info->scanline_extents).conservative.n0) + 1;
        }
        if ((info->vertical).is_gather == 0) {
          __assert_fail("stbir_info->vertical.is_gather",
                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/stb_image_resize2.h"
                        ,0x182b,
                        "void stbir__resample_vertical_gather(const stbir__info *, stbir__per_split_info *, int, int, int, const float *)"
                       );
        }
        iVar19 = iVar19 - iVar1;
        if (iVar19 < 0) {
          __assert_fail("total > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/stb_image_resize2.h"
                        ,0x1831,
                        "void stbir__resample_vertical_gather(const stbir__info *, stbir__per_split_info *, int, int, int, const float *)"
                       );
        }
        pfVar11 = split_info->decode_buffer;
        pfVar6 = split_info->vertical_buffer;
        iVar18 = info->effective_channels;
        uVar20 = iVar19 + 1;
        pfVar14 = pfVar11;
        if (iVar17 == 0) {
          pfVar14 = pfVar6;
        }
        uVar25 = 0;
        do {
          uVar24 = 8;
          if (uVar20 < 8) {
            uVar24 = (ulong)uVar20;
          }
          uVar23 = 0;
          do {
            pfVar12 = stbir__get_ring_buffer_scanline(info,split_info,(int)uVar23 + iVar1 + uVar25);
            local_78[uVar23] = pfVar12;
            uVar23 = uVar23 + 1;
          } while (uVar24 != uVar23);
          ppSVar13 = stbir__vertical_gathers_continues;
          if (uVar25 == 0) {
            ppSVar13 = stbir__vertical_gathers;
          }
          iVar19 = (int)uVar24;
          (*ppSVar13[(long)iVar19 + -1])
                    (pfVar14,local_d0 + uVar25,local_78,local_78[0] + (long)iVar16 * (long)iVar18);
          uVar25 = uVar25 + iVar19;
          uVar20 = uVar20 - iVar19;
        } while (uVar20 != 0);
        if (iVar17 != 0) {
          stbir__resample_horizontal_gather(info,pfVar6,pfVar11);
        }
        stbir__encode_scanline
                  (info,(void *)(info->output_stride_bytes * lVar27 + (long)info->output_data),
                   pfVar6,(int)lVar27);
        psVar21 = psVar21 + 1;
        pfVar11 = (float *)(long)(info->vertical).coefficient_width;
        local_d0 = local_d0 + (long)pfVar11;
        lVar27 = lVar27 + 1;
      } while (iVar2 != (int)lVar27);
    }
  }
  return (int)pfVar11;
}

Assistant:

static int stbir__perform_resize( stbir__info const * info, int split_start, int split_count )
{
  stbir__per_split_info * split_info = info->split_info + split_start;

  STBIR_PROFILE_CLEAR_EXTRAS();

  STBIR_PROFILE_FIRST_START( looping );
  if (info->vertical.is_gather)
    stbir__vertical_gather_loop( info, split_info, split_count );
  else
    stbir__vertical_scatter_loop( info, split_info, split_count );
  STBIR_PROFILE_END( looping );

  return 1;
}